

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::init
          (TextureBorderClampPerAxisCase3D *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *this_00;
  ostringstream *poVar1;
  deUint32 format;
  Context *pCVar2;
  RenderContext *renderCtx;
  ContextInfo *contextInfo;
  pointer pfVar3;
  _Alloc_hider _Var4;
  undefined1 auVar5 [8];
  bool bVar6;
  bool bVar7;
  ContextType CVar8;
  GLSLVersion glslVersion;
  CompressedTexFormat format_00;
  float format_01;
  RenderTarget *pRVar9;
  TextureFormat TVar10;
  TextureRenderer *this_01;
  char *__s;
  size_t sVar11;
  NotSupportedError *pNVar12;
  TextureFormat *pTVar13;
  GenericVec4 GVar14;
  CompressedTexFormat compressedFormat;
  PixelBufferAccess stencilAccess;
  TexDecompressionParams decompressionParams;
  PixelBufferAccess depthAccess;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  TextureFormat TStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248 [2];
  undefined1 local_228 [8];
  _func_int **pp_Stack_220;
  string local_1f8;
  int local_1d8 [2];
  undefined1 local_1d0 [8];
  TextureFormat TStack_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  pointer local_1b0;
  float afStack_1a8 [2];
  float local_1a0 [2];
  float afStack_198 [16];
  ios_base local_158 [264];
  string local_50;
  
  CVar8.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar6 = glu::contextSupports(CVar8,(ApiType)0x23);
  CVar8.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(CVar8);
  if (!bVar6) {
    bVar7 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_border_clamp");
    if (!bVar7) {
      pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1d0 = (undefined1  [8])((long)local_1d0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"Test requires GL_EXT_texture_border_clamp extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar12,(string *)local_1d0);
      __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  bVar7 = glu::isCompressedFormat(this->m_texFormat);
  if (!bVar6 && bVar7) {
    format_00 = glu::mapGLCompressedTexFormat(this->m_texFormat);
    bVar6 = tcu::isAstcFormat(format_00);
    if (bVar6) {
      bVar6 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_KHR_texture_compression_astc_ldr");
      if (!bVar6) {
        pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        local_1d0 = (undefined1  [8])((long)local_1d0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d0,"Test requires GL_KHR_texture_compression_astc_ldr extension"
                   ,"");
        tcu::NotSupportedError::NotSupportedError(pNVar12,(string *)local_1d0);
        __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  if (this->m_texFormat == 0x80e1) {
    bVar6 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_texture_format_BGRA8888");
    if (!bVar6) {
      pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1d0 = (undefined1  [8])((long)local_1d0 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"Test requires GL_EXT_texture_format_BGRA8888 extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar12,(string *)local_1d0);
      __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar9->m_width < 0x80) {
LAB_014f5738:
    pNVar12 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_1d8[1] = 0x80;
    de::toString<int>(&local_1f8,local_1d8 + 1);
    std::operator+(&local_278,"Test requires ",&local_1f8);
    pTVar13 = (TextureFormat *)std::__cxx11::string::append((char *)&local_278);
    local_258 = *(undefined1 (*) [8])pTVar13;
    TVar10 = (TextureFormat)(pTVar13 + 2);
    if ((TextureFormat)local_258 == TVar10) {
      local_248[0]._0_8_ = *(undefined8 *)TVar10;
      local_248[0]._8_8_ = pTVar13[3];
      local_258 = (undefined1  [8])local_248;
    }
    else {
      local_248[0]._0_8_ = *(undefined8 *)TVar10;
    }
    TStack_250 = pTVar13[1];
    *pTVar13 = TVar10;
    pTVar13[1].order = R;
    pTVar13[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar13[2].order = R;
    local_1d8[0] = 0x80;
    de::toString<int>(&local_50,local_1d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   &local_50);
    pTVar13 = (TextureFormat *)std::__cxx11::string::append(local_228);
    local_1d0 = *(undefined1 (*) [8])pTVar13;
    TVar10 = (TextureFormat)(pTVar13 + 2);
    if ((TextureFormat)local_1d0 == TVar10) {
      local_1c0._M_allocated_capacity = *(undefined8 *)TVar10;
      local_1c0._8_8_ = pTVar13[3];
      local_1d0 = (undefined1  [8])((long)local_1d0 + 0x10);
    }
    else {
      local_1c0._M_allocated_capacity = *(undefined8 *)TVar10;
    }
    TStack_1c8 = pTVar13[1];
    *pTVar13 = TVar10;
    pTVar13[1].order = R;
    pTVar13[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar13[2].order = R;
    tcu::NotSupportedError::NotSupportedError(pNVar12,(string *)local_1d0);
    __cxa_throw(pNVar12,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar9->m_height < 0x80) goto LAB_014f5738;
  pCVar2 = (this->super_TestCase).m_context;
  renderCtx = pCVar2->m_renderCtx;
  contextInfo = pCVar2->m_contextInfo;
  format = this->m_texFormat;
  local_278._M_dataplus._M_p = (pointer)0x0;
  bVar6 = isDepthFormat(format,MODE_DEPTH);
  if (bVar6) {
LAB_014f5143:
    TextureTraits<glu::Texture3D>::createTextureFromInternalFormat
              ((MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_1d0,renderCtx,
               format,&this->m_size);
    auVar5 = local_1d0;
    local_1d0._0_4_ = R;
    local_1d0._4_4_ = SNORM_INT8;
    if ((undefined1  [8])local_278._M_dataplus._M_p != auVar5) {
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_278);
      local_278._M_dataplus._M_p = (pointer)auVar5;
    }
    de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
              ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_1d0);
    tcu::Texture3D::allocLevel((Texture3D *)((long)local_278._M_dataplus._M_p + 0x10),0);
    bVar6 = isDepthFormat(format,MODE_DEPTH);
    if (bVar6) {
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)local_1d0,
                 (((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                  ((long)local_278._M_dataplus._M_p + 0x30))->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start,MODE_DEPTH);
      local_228._0_4_ = R;
      local_228._4_4_ = SNORM_INT8;
      pp_Stack_220 = (_func_int **)0x0;
      local_258._0_4_ = 0x3f800000;
      local_258._4_4_ = 0x3f800000;
      TStack_250.order = 0x3f800000;
      TStack_250.type = 0x3f800000;
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)local_1d0,(Vec4 *)local_228,(Vec4 *)local_258);
    }
    bVar6 = isStencilFormat(format,MODE_STENCIL);
    if (bVar6) {
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)local_228,
                 (((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                  ((long)local_278._M_dataplus._M_p + 0x30))->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start,MODE_STENCIL);
      tcu::getTextureFormatInfo((TextureFormatInfo *)local_1d0,(TextureFormat *)local_228);
      tcu::flipYAccess((PixelBufferAccess *)local_258,(PixelBufferAccess *)local_228);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)local_258,(Vec4 *)(local_1d0 + 0x10),(Vec4 *)local_1d0);
    }
  }
  else {
    bVar6 = isStencilFormat(format,MODE_STENCIL);
    if (bVar6) goto LAB_014f5143;
    bVar6 = glu::isCompressedFormat(format);
    if (bVar6) {
      format_01 = (float)glu::mapGLCompressedTexFormat(format);
      local_258._0_4_ = format_01;
      tcu::CompressedTexture::CompressedTexture
                ((CompressedTexture *)local_1d0,(CompressedTexFormat)format_01,
                 (this->m_size).m_data[0],(this->m_size).m_data[1],(this->m_size).m_data[2]);
      bVar6 = tcu::isAstcFormat((CompressedTexFormat)format_01);
      local_1f8._M_dataplus._M_p._0_4_ = (uint)!bVar6 * 2;
      generateDummyCompressedData((CompressedTexture *)local_1d0,(CompressedTexFormat *)local_258);
      TVar10 = (TextureFormat)operator_new(0x70);
      glu::Texture3D::Texture3D
                ((Texture3D *)TVar10,renderCtx,contextInfo,1,(CompressedTexture *)local_1d0,
                 (TexDecompressionParams *)&local_1f8);
      local_228._0_4_ = R;
      local_228._4_4_ = SNORM_INT8;
      if ((TextureFormat)local_278._M_dataplus._M_p != TVar10) {
        de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                  ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_278);
        local_278._M_dataplus._M_p = (pointer)TVar10;
      }
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_228);
      tcu::CompressedTexture::~CompressedTexture((CompressedTexture *)local_1d0);
      goto LAB_014f5460;
    }
    if (((format - 0x1906 < 5) && ((0x19U >> (format - 0x1906 & 0x1f) & 1) != 0)) ||
       (format == 0x80e1)) {
      TVar10 = (TextureFormat)operator_new(0x70);
      glu::Texture3D::Texture3D
                ((Texture3D *)TVar10,renderCtx,format,0x1401,(this->m_size).m_data[0],
                 (this->m_size).m_data[1],(this->m_size).m_data[2]);
      local_1d0._0_4_ = R;
      local_1d0._4_4_ = SNORM_INT8;
      if ((TextureFormat)local_278._M_dataplus._M_p != TVar10) {
        de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                  ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_278);
        local_278._M_dataplus._M_p = (pointer)TVar10;
      }
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_1d0);
    }
    else {
      TextureTraits<glu::Texture3D>::createTextureFromInternalFormat
                ((MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_1d0,renderCtx
                 ,format,&this->m_size);
      auVar5 = local_1d0;
      local_1d0._0_4_ = R;
      local_1d0._4_4_ = SNORM_INT8;
      if ((undefined1  [8])local_278._M_dataplus._M_p != auVar5) {
        de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                  ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_278);
        local_278._M_dataplus._M_p = (pointer)auVar5;
      }
      de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
                ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)local_1d0);
    }
    tcu::Texture3D::allocLevel((Texture3D *)((long)local_278._M_dataplus._M_p + 0x10),0);
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)local_1d0,
               (TextureFormat *)((long)local_278._M_dataplus._M_p + 0x10));
    local_228 = local_1d0;
    pp_Stack_220 = (_func_int **)TStack_1c8;
    local_258 = (undefined1  [8])local_1c0._M_allocated_capacity;
    TStack_250.order = local_1c0._8_4_;
    TStack_250.type = local_1c0._12_4_;
    tcu::fillWithComponentGradients
              ((((vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *)
                ((long)local_278._M_dataplus._M_p + 0x30))->
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>).
               _M_impl.super__Vector_impl_data._M_start,(Vec4 *)local_228,(Vec4 *)local_258);
  }
  glu::Texture3D::upload((Texture3D *)local_278._M_dataplus._M_p);
LAB_014f5460:
  _Var4._M_p = local_278._M_dataplus._M_p;
  local_278._M_dataplus._M_p = (pointer)0x0;
  this_00 = &this->m_texture;
  if ((this->m_texture).super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data
      .ptr != (Texture3D *)_Var4._M_p) {
    de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
              (&this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
    (this_00->super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.ptr =
         (Texture3D *)_Var4._M_p;
  }
  de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::reset
            ((UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_278);
  this_01 = (TextureRenderer *)operator_new(0x58);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (this_01,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,glslVersion,
             PRECISION_HIGHP);
  local_1d0._0_4_ = R;
  local_1d0._4_4_ = SNORM_INT8;
  if ((this->m_renderer).
      super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
      .m_data.ptr != this_01) {
    de::details::
    UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
    ::reset(&(this->m_renderer).
             super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
           );
    (this->m_renderer).
    super_UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
    .m_data.ptr = this_01;
  }
  de::details::
  UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  ::reset((UniqueBase<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
           *)local_1d0);
  local_1d0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Created 3D texture with format ",0x1f);
  __s = glu::getTextureFormatName(this->m_texFormat);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(_func_int **)((long)TStack_1c8 + -0x18));
  }
  else {
    sVar11 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", size (",8);
  std::ostream::operator<<
            (poVar1,(((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).m_width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<
            (poVar1,(((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).m_height);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
  std::ostream::operator<<
            (poVar1,(((this_00->
                      super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>).m_data.
                     ptr)->m_refTexture).m_depth);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")\n",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_158);
  local_1d0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Setting tex coords bottom-left: (-1, -1, -1.5), top-right (2, 2, 2.5)\n",0x46);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_158);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_texCoords,0xc);
  pfVar3 = (this->m_texCoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3[0] = -1.0;
  pfVar3[1] = -1.0;
  pfVar3[2] = -1.5;
  pfVar3[3] = -1.0;
  pfVar3[4] = 2.0;
  pfVar3[5] = 0.5;
  pfVar3[6] = 2.0;
  pfVar3[7] = -1.0;
  pfVar3[8] = 0.5;
  pfVar3[9] = 2.0;
  pfVar3[10] = 2.0;
  pfVar3[0xb] = 2.5;
  local_258 = *(undefined1 (*) [8])
               &(((this->m_texture).
                  super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>.m_data.ptr)
                ->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_1d0,(TextureFormat *)local_258);
  local_228._0_4_ = 0x3e4ccccd;
  local_228._4_4_ = 0x3f19999a;
  pp_Stack_220 = (_func_int **)0x3ecccccd3f666666;
  GVar14 = mapToFormatColorRepresentable((TextureFormat *)local_258,(Vec4 *)local_228);
  (this->m_borderColor).v.uData[0] = GVar14.v._0_4_;
  (this->m_borderColor).v.uData[1] = GVar14.v._4_4_;
  (this->m_borderColor).v.uData[2] = GVar14.v._8_4_;
  (this->m_borderColor).v.uData[3] = GVar14.v._12_4_;
  *(pointer *)(this->m_lookupScale).m_data = local_1b0;
  *(float (*) [2])((this->m_lookupScale).m_data + 2) = afStack_1a8;
  *(float (*) [2])(this->m_lookupBias).m_data = local_1a0;
  *(undefined8 *)((this->m_lookupBias).m_data + 2) = afStack_198._0_8_;
  return GVar14.v._4_4_;
}

Assistant:

void TextureBorderClampPerAxisCase3D::init (void)
{
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_border_clamp"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_border_clamp extension");

	if (glu::isCompressedFormat(m_texFormat)													&&
		!supportsES32																			&&
		tcu::isAstcFormat(glu::mapGLCompressedTexFormat(m_texFormat))							&&
		!m_context.getContextInfo().isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
	{
		throw tcu::NotSupportedError("Test requires GL_KHR_texture_compression_astc_ldr extension");
	}
	if (m_texFormat == GL_BGRA && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_format_BGRA8888"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_format_BGRA8888 extension");
	if (m_context.getRenderTarget().getWidth() < VIEWPORT_WIDTH ||
		m_context.getRenderTarget().getHeight() < VIEWPORT_HEIGHT)
	{
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(VIEWPORT_WIDTH) + "x" + de::toString<int>(VIEWPORT_HEIGHT) + " viewport");
	}

	// resources
	m_texture = genDummyTexture<glu::Texture3D>(m_context.getRenderContext(), m_context.getContextInfo(), m_texFormat, m_size);
	m_renderer = de::MovePtr<gls::TextureTestUtil::TextureRenderer>(new gls::TextureTestUtil::TextureRenderer(m_context.getRenderContext(), m_testCtx.getLog(), glslVersion, glu::PRECISION_HIGHP));

	// texture info
	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Created 3D texture with format " << glu::getTextureFormatName(m_texFormat)
						<< ", size (" << m_texture->getRefTexture().getWidth() << ", " << m_texture->getRefTexture().getHeight() << ", " << m_texture->getRefTexture().getDepth() << ")\n"
						<< tcu::TestLog::EndMessage;

	// tex coord
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Setting tex coords bottom-left: (-1, -1, -1.5), top-right (2, 2, 2.5)\n"
							<< tcu::TestLog::EndMessage;

		m_texCoords.resize(4*3);

		m_texCoords[0] = -1.0f; m_texCoords[ 1] = -1.0f; m_texCoords[ 2] = -1.5f;
		m_texCoords[3] = -1.0f; m_texCoords[ 4] =  2.0f; m_texCoords[ 5] = 0.5f;
		m_texCoords[6] =  2.0f; m_texCoords[ 7] = -1.0f; m_texCoords[ 8] = 0.5f;
		m_texCoords[9] =  2.0f; m_texCoords[10] =  2.0f; m_texCoords[11] =  2.5f;
	}

	// set render params
	{
		const tcu::TextureFormat		texFormat		= m_texture->getRefTexture().getFormat();
		const tcu::TextureFormatInfo	texFormatInfo	= tcu::getTextureFormatInfo(texFormat);

		m_borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.2f, 0.6f, 0.9f, 0.4f));

		m_lookupScale	= texFormatInfo.lookupScale;
		m_lookupBias	= texFormatInfo.lookupBias;
	}
}